

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O0

int __thiscall ncnn::ExpandDims::load_param(ExpandDims *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  Mat *pMVar3;
  ParamDict *in_RSI;
  long in_RDI;
  Mat local_160;
  Mat local_118;
  ParamDict *local_d0;
  Mat *local_c0;
  int local_b8;
  undefined4 local_b4;
  Mat *local_b0;
  Mat *local_a8;
  Mat *local_a0;
  Mat *local_98;
  Mat *local_88;
  int local_68;
  undefined4 local_64;
  Mat *local_60;
  int local_48;
  undefined4 local_44;
  Mat *local_40;
  int local_38;
  undefined4 local_34;
  Mat *local_30;
  void *local_28;
  void *local_10;
  
  local_d0 = in_RSI;
  iVar2 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get(local_d0,1,0);
  *(int *)(in_RDI + 0xd4) = iVar2;
  iVar2 = ParamDict::get(local_d0,2,0);
  *(int *)(in_RDI + 0xd8) = iVar2;
  local_c0 = &local_160;
  local_160.data = (void *)0x0;
  local_160.refcount = (int *)0x0;
  local_160.elemsize = 0;
  local_160.elempack = 0;
  local_160.allocator = (Allocator *)0x0;
  local_160.dims = 0;
  local_160.w = 0;
  local_160.h = 0;
  local_160.d = 0;
  local_160.c = 0;
  local_160.cstep = 0;
  ParamDict::get(&local_118,local_d0,3,local_c0);
  pMVar3 = (Mat *)(in_RDI + 0xe0);
  local_b0 = &local_118;
  local_a8 = pMVar3;
  if (pMVar3 != local_b0) {
    if (local_118.refcount != (int *)0x0) {
      local_b4 = 1;
      LOCK();
      local_b8 = *local_118.refcount;
      *local_118.refcount = *local_118.refcount + 1;
      UNLOCK();
    }
    local_30 = pMVar3;
    if (*(long *)(in_RDI + 0xe8) != 0) {
      piVar1 = *(int **)(in_RDI + 0xe8);
      local_34 = 0xffffffff;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_38 == 1) {
        if (*(long *)(in_RDI + 0x100) == 0) {
          local_28 = pMVar3->data;
          if (local_28 != (void *)0x0) {
            free(local_28);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    *(undefined4 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    pMVar3->data = local_b0->data;
    *(int **)(in_RDI + 0xe8) = local_b0->refcount;
    *(size_t *)(in_RDI + 0xf0) = local_b0->elemsize;
    *(int *)(in_RDI + 0xf8) = local_b0->elempack;
    *(Allocator **)(in_RDI + 0x100) = local_b0->allocator;
    *(int *)(in_RDI + 0x108) = local_b0->dims;
    *(int *)(in_RDI + 0x10c) = local_b0->w;
    *(int *)(in_RDI + 0x110) = local_b0->h;
    *(int *)(in_RDI + 0x114) = local_b0->d;
    *(int *)(in_RDI + 0x118) = local_b0->c;
    *(size_t *)(in_RDI + 0x120) = local_b0->cstep;
  }
  local_98 = &local_118;
  local_a0 = pMVar3;
  local_40 = local_98;
  if (local_118.refcount != (int *)0x0) {
    local_44 = 0xffffffff;
    LOCK();
    local_48 = *local_118.refcount;
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if (local_48 == 1) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])(local_118.allocator,local_118.data);
      }
    }
  }
  local_118.data = (void *)0x0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_118.cstep = 0;
  local_118.refcount = (int *)0x0;
  local_88 = &local_160;
  if (local_160.refcount != (int *)0x0) {
    local_64 = 0xffffffff;
    LOCK();
    local_68 = *local_160.refcount;
    *local_160.refcount = *local_160.refcount + -1;
    UNLOCK();
    if (local_68 == 1) {
      local_60 = local_88;
      if (local_160.allocator == (Allocator *)0x0) {
        local_10 = local_160.data;
        if (local_160.data != (void *)0x0) {
          free(local_160.data);
        }
      }
      else {
        (*(local_160.allocator)->_vptr_Allocator[3])(local_160.allocator,local_160.data);
      }
    }
  }
  return 0;
}

Assistant:

int ExpandDims::load_param(const ParamDict& pd)
{
    expand_w = pd.get(0, 0);
    expand_h = pd.get(1, 0);
    expand_c = pd.get(2, 0);
    axes = pd.get(3, Mat());

    return 0;
}